

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall
FloatInterval_DifferenceOfProducts_Test::TestBody(FloatInterval_DifferenceOfProducts_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  uint64_t sequenceIndex;
  Float FVar4;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Interval IVar5;
  undefined8 extraout_XMM0_Qb;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 extraout_var_04 [56];
  Float maxExp;
  double in_XMM1_Qa;
  double extraout_XMM1_Qa;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  AssertionResult gtest_ar;
  Interval b;
  AssertHelper local_b8;
  Interval c;
  undefined1 local_98 [16];
  double pr;
  Interval d;
  Interval a;
  RNG rng;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  for (sequenceIndex = 0; maxExp = SUB84(in_XMM1_Qa,0), FVar4 = in_ZMM0._0_4_,
      sequenceIndex != 1000000; sequenceIndex = sequenceIndex + 1) {
    pbrt::RNG::SetSequence(&rng,sequenceIndex);
    IVar5 = getFloat(&rng,FVar4,maxExp);
    auVar10._0_8_ = pbrt::Abs(IVar5);
    auVar10._8_56_ = extraout_var_00;
    a = (Interval)vmovlps_avx(auVar10._0_16_);
    IVar5 = getFloat(&rng,auVar10._0_4_,maxExp);
    auVar11._0_8_ = pbrt::Abs(IVar5);
    auVar11._8_56_ = extraout_var_01;
    b = (Interval)vmovlps_avx(auVar11._0_16_);
    IVar5 = getFloat(&rng,auVar11._0_4_,maxExp);
    auVar12._0_8_ = pbrt::Abs(IVar5);
    auVar12._8_56_ = extraout_var_02;
    c = (Interval)vmovlps_avx(auVar12._0_16_);
    IVar5 = getFloat(&rng,auVar12._0_4_,maxExp);
    auVar13._0_8_ = pbrt::Abs(IVar5);
    auVar13._8_56_ = extraout_var_03;
    d = (Interval)vmovlps_avx(auVar13._0_16_);
    auVar14._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    auVar14._4_60_ = extraout_var;
    uVar1 = vcmpss_avx512f(auVar14._0_16_,ZEXT416(0xbf000000),1);
    bVar2 = (bool)((byte)uVar1 & 1);
    FVar4 = (Float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * 0x3f800000);
    pbrt::Interval::operator*=(&b,FVar4);
    pbrt::Interval::operator*=(&c,FVar4);
    dVar6 = getPrecise(&a,&rng);
    dVar7 = getPrecise(&b,&rng);
    dVar8 = getPrecise(&c,&rng);
    dVar9 = getPrecise(&d,&rng);
    IVar5 = pbrt::DifferenceOfProducts(auVar10._0_8_,b,c,auVar13._0_8_);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar8;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar9;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar7;
    local_98._8_8_ = extraout_XMM0_Qb;
    local_98._0_4_ = IVar5.low;
    local_98._4_4_ = IVar5.high;
    local_d8.ptr_._0_4_ = IVar5.low;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar6;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar8 * dVar9;
    auVar19 = vfmsub132sd_fma(auVar16,auVar15,auVar19);
    auVar15 = vfnmadd213sd_fma(auVar18,auVar17,auVar15);
    in_XMM1_Qa = auVar19._0_8_ + auVar15._0_8_;
    pr = in_XMM1_Qa;
    testing::internal::CmpHelperGE<double,float>
              ((internal *)&gtest_ar,"pr","r.LowerBound()",&pr,(float *)&local_d8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_d8);
      std::ostream::operator<<
                ((void *)(CONCAT44(local_d8.ptr_._4_4_,local_d8.ptr_._0_4_) + 0x10),
                 (int)sequenceIndex);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      in_XMM1_Qa = extraout_XMM1_Qa;
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                 ,0x32a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_d8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    in_ZMM0 = ZEXT1664(local_98);
    local_d8.ptr_._0_4_ = (Float)vextractps_avx(local_98,1);
    testing::internal::CmpHelperLE<double,float>
              ((internal *)&gtest_ar,"pr","r.UpperBound()",&pr,(float *)&local_d8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_d8);
      auVar19 = std::ostream::operator<<
                          ((void *)(CONCAT44(local_d8.ptr_._4_4_,local_d8.ptr_._0_4_) + 0x10),
                           (int)sequenceIndex);
      in_XMM1_Qa = auVar19._8_8_;
      in_ZMM0._0_8_ = auVar19._0_8_;
      in_ZMM0._8_56_ = extraout_var_04;
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                 ,0x32b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_d8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(FloatInterval, DifferenceOfProducts) {
    for (int trial = 0; trial < kFloatIntervalIters; ++trial) {
        RNG rng(trial);

        Interval a = Abs(getFloat(rng));
        Interval b = Abs(getFloat(rng));
        Interval c = Abs(getFloat(rng));
        Interval d = Abs(getFloat(rng));

        Float sign = rng.Uniform<Float>() < -0.5 ? -1 : 1;
        b *= sign;
        c *= sign;

        double pa = getPrecise(a, rng);
        double pb = getPrecise(b, rng);
        double pc = getPrecise(c, rng);
        double pd = getPrecise(d, rng);

        Interval r = DifferenceOfProducts(a, b, c, d);
        double pr = DifferenceOfProducts(pa, pb, pc, pd);

        EXPECT_GE(pr, r.LowerBound()) << trial;
        EXPECT_LE(pr, r.UpperBound()) << trial;
    }
}